

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void __thiscall State::apply(State *this,State *dst)

{
  pointer pfVar1;
  rep rVar2;
  pointer pfVar3;
  undefined7 uVar4;
  bool bVar5;
  undefined3 uVar6;
  float fVar7;
  Type TVar8;
  undefined2 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  int iVar18;
  int iVar19;
  
  if (this->update != false) {
    if ((this->flags).newMessage == true) {
      dst->update = true;
      (dst->flags).newMessage = true;
      uVar4 = *(undefined7 *)&(this->message).field_0x1;
      rVar2 = (this->message).timestamp.__d.__r;
      (dst->message).received = (this->message).received;
      *(undefined7 *)&(dst->message).field_0x1 = uVar4;
      (dst->message).timestamp.__d.__r = rVar2;
      std::__cxx11::string::operator=
                ((string *)&(dst->message).data,(string *)&(this->message).data);
      bVar5 = (this->message).dss;
      uVar6 = *(undefined3 *)&(this->message).field_0x35;
      fVar7 = (this->message).volume;
      TVar8 = (this->message).type;
      (dst->message).protocolId = (this->message).protocolId;
      (dst->message).dss = bVar5;
      *(undefined3 *)&(dst->message).field_0x35 = uVar6;
      (dst->message).volume = fVar7;
      (dst->message).type = TVar8;
    }
    if ((this->flags).newSpectrum == true) {
      dst->update = true;
      (dst->flags).newSpectrum = true;
      pfVar1 = (dst->rxSpectrum).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar3 = (this->rxSpectrum).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
      (dst->rxSpectrum).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start =
           (this->rxSpectrum).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
      (dst->rxSpectrum).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar3;
      (dst->rxSpectrum).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (this->rxSpectrum).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (this->rxSpectrum).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->rxSpectrum).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->rxSpectrum).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pfVar1 != (pointer)0x0) {
        operator_delete(pfVar1);
      }
    }
    if ((this->flags).newTxAmplitude == true) {
      dst->update = true;
      (dst->flags).newTxAmplitude = true;
      ggvector<short>::assign((ggvector *)&dst->txAmplitude);
    }
    if ((this->flags).newStats == true) {
      dst->update = true;
      (dst->flags).newStats = true;
      bVar5 = (this->stats).analyzing;
      uVar9 = *(undefined2 *)&(this->stats).field_0x2;
      iVar10 = (this->stats).framesToRecord;
      iVar11 = (this->stats).framesLeftToRecord;
      iVar12 = (this->stats).framesToAnalyze;
      iVar13 = (this->stats).framesLeftToAnalyze;
      iVar14 = (this->stats).samplesPerFrame;
      fVar7 = (this->stats).sampleRateInp;
      fVar15 = (this->stats).sampleRateOut;
      fVar16 = (this->stats).sampleRateOut;
      fVar17 = (this->stats).sampleRate;
      iVar18 = (this->stats).sampleSizeInp;
      iVar19 = (this->stats).sampleSizeOut;
      (dst->stats).receiving = (this->stats).receiving;
      (dst->stats).analyzing = bVar5;
      *(undefined2 *)&(dst->stats).field_0x2 = uVar9;
      (dst->stats).framesToRecord = iVar10;
      (dst->stats).framesLeftToRecord = iVar11;
      (dst->stats).framesToAnalyze = iVar12;
      (dst->stats).framesLeftToAnalyze = iVar13;
      (dst->stats).samplesPerFrame = iVar14;
      (dst->stats).sampleRateInp = fVar7;
      (dst->stats).sampleRateOut = fVar15;
      (dst->stats).sampleRateOut = fVar16;
      (dst->stats).sampleRate = fVar17;
      (dst->stats).sampleSizeInp = iVar18;
      (dst->stats).sampleSizeOut = iVar19;
    }
    if ((this->flags).newTxProtocols == true) {
      dst->update = true;
      (dst->flags).newTxProtocols = true;
      memcpy(&dst->txProtocols,&this->txProtocols,0x160);
    }
    (this->flags).newStats = false;
    (this->flags).newTxProtocols = false;
    this->update = false;
    (this->flags).newMessage = false;
    (this->flags).newSpectrum = false;
    (this->flags).newTxAmplitude = false;
  }
  return;
}

Assistant:

void apply(State & dst) {
        if (update == false) return;

        if (this->flags.newMessage) {
            dst.update = true;
            dst.flags.newMessage = true;
            dst.message = std::move(this->message);
        }

        if (this->flags.newSpectrum) {
            dst.update = true;
            dst.flags.newSpectrum = true;
            dst.rxSpectrum = std::move(this->rxSpectrum);
        }

        if (this->flags.newTxAmplitude) {
            dst.update = true;
            dst.flags.newTxAmplitude = true;
            dst.txAmplitude.assign(this->txAmplitude);
        }

        if (this->flags.newStats) {
            dst.update = true;
            dst.flags.newStats = true;
            dst.stats = std::move(this->stats);
        }

        if (this->flags.newTxProtocols) {
            dst.update = true;
            dst.flags.newTxProtocols = true;
            dst.txProtocols = std::move(this->txProtocols);
        }

        flags.clear();
        update = false;
    }